

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rsgVariableManager.cpp
# Opt level: O2

void __thiscall
rsg::ValueScope::setValue(ValueScope *this,Variable *variable,ConstValueRangeAccess value)

{
  ValueEntry *pVVar1;
  pointer pSVar2;
  StridedValueAccess<1> local_48;
  StridedValueRead<1> local_38;
  
  pVVar1 = findEntry(this,variable);
  local_48.super_ConstStridedValueAccess<1>.m_value =
       (pVVar1->m_valueRange).m_min.super__Vector_base<rsg::Scalar,_std::allocator<rsg::Scalar>_>.
       _M_impl.super__Vector_impl_data._M_start;
  pSVar2 = (pVVar1->m_valueRange).m_max.
           super__Vector_base<rsg::Scalar,_std::allocator<rsg::Scalar>_>._M_impl.
           super__Vector_impl_data._M_start;
  if (local_48.super_ConstStridedValueAccess<1>.m_value ==
      (pVVar1->m_valueRange).m_min.super__Vector_base<rsg::Scalar,_std::allocator<rsg::Scalar>_>.
      _M_impl.super__Vector_impl_data._M_finish) {
    local_48.super_ConstStridedValueAccess<1>.m_value = (pointer)0x0;
  }
  if (pSVar2 == (pVVar1->m_valueRange).m_max.
                super__Vector_base<rsg::Scalar,_std::allocator<rsg::Scalar>_>._M_impl.
                super__Vector_impl_data._M_finish) {
    pSVar2 = (pointer)0x0;
  }
  local_38.m_type = value.m_type;
  local_38.m_value = value.m_min;
  local_48.super_ConstStridedValueAccess<1>.m_type = &(pVVar1->m_valueRange).m_type;
  StridedValueAccess<1>::operator=(&local_48,&local_38);
  local_38.m_type = value.m_type;
  local_38.m_value = value.m_max;
  local_48.super_ConstStridedValueAccess<1>.m_type = &(pVVar1->m_valueRange).m_type;
  local_48.super_ConstStridedValueAccess<1>.m_value = pSVar2;
  StridedValueAccess<1>::operator=(&local_48,&local_38);
  return;
}

Assistant:

void ValueScope::setValue (const Variable* variable, ConstValueRangeAccess value)
{
	ValueEntry* entry = findEntry(variable);
	DE_ASSERT(entry);

	ValueRangeAccess dst = entry->getValueRange();
	dst.getMin() = value.getMin().value();
	dst.getMax() = value.getMax().value();
}